

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::
emplaceRealloc<slang::ast::GenerateBlockSymbol_const&,int&>
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,pointer pos,
          GenerateBlockSymbol *args,int *args_1)

{
  Element *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  Symbol *pSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pEVar8;
  pointer pEVar9;
  pointer pEVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar3 = this->cap;
  if (uVar14 < uVar3 * 2) {
    uVar14 = uVar3 * 2;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    uVar14 = 0x3ffffffffffffff;
  }
  lVar13 = (long)pos - (long)this->data_;
  pEVar10 = (pointer)operator_new(uVar14 << 5);
  this_00 = (Element *)((long)pEVar10 + lVar13);
  ast::HierarchicalReference::Element::Element(this_00,&args->super_Symbol,*args_1);
  p = this->data_;
  lVar11 = this->len * 0x20;
  lVar12 = (long)p + (lVar11 - (long)pos);
  pEVar8 = p;
  pEVar9 = pEVar10;
  if (lVar12 == 0) {
    if (this->len != 0) {
      lVar12 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(p->symbol).ptr + lVar12);
        uVar5 = *puVar2;
        uVar6 = puVar2[1];
        puVar2 = (undefined8 *)
                 ((long)&(p->selector).
                         super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         .
                         super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                 + lVar12 + 8);
        uVar7 = puVar2[1];
        puVar1 = (undefined8 *)
                 ((long)&(pEVar10->selector).
                         super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         .
                         super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                         .
                         super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                 + lVar12 + 8);
        *puVar1 = *puVar2;
        puVar1[1] = uVar7;
        puVar2 = (undefined8 *)((long)&(pEVar10->symbol).ptr + lVar12);
        *puVar2 = uVar5;
        puVar2[1] = uVar6;
        lVar12 = lVar12 + 0x20;
      } while (lVar11 != lVar12);
    }
  }
  else {
    for (; pEVar8 != pos; pEVar8 = pEVar8 + 1) {
      pSVar4 = (pEVar8->symbol).ptr;
      uVar5 = *(undefined8 *)
               &(pEVar8->selector).
                super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
                super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                ._M_u;
      uVar6 = *(undefined8 *)
               ((long)&(pEVar8->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + 0x10);
      *(undefined8 *)
       ((long)&(pEVar9->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> + 8)
           = *(undefined8 *)
              ((long)&(pEVar8->selector).
                      super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                      .
                      super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
              + 8);
      *(undefined8 *)
       ((long)&(pEVar9->selector).
               super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
               super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> +
       0x10) = uVar6;
      (pEVar9->symbol).ptr = pSVar4;
      *(undefined8 *)
       &(pEVar9->selector).
        super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>.
        super__Variant_storage_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_> =
           uVar5;
      pEVar9 = pEVar9 + 1;
    }
    memcpy((void *)((long)pEVar10 + lVar13 + 0x20),pos,(lVar12 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar14;
  this->data_ = pEVar10;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}